

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_frozen_serialize(roaring_bitmap_t *rb,char *buf)

{
  char *__dest;
  uint8_t uVar1;
  int *piVar2;
  bitset_container_t *bitset;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char *res_1;
  char *__dest_00;
  long lVar7;
  long lVar8;
  char *__dest_01;
  long lVar9;
  long lVar10;
  char *res_2;
  char *__dest_02;
  
  iVar3 = (rb->high_low_container).size;
  lVar9 = (long)iVar3;
  if (lVar9 < 1) {
    lVar4 = 0;
    lVar8 = 0;
    lVar6 = 0;
  }
  else {
    lVar7 = 0;
    lVar6 = 0;
    lVar8 = 0;
    lVar4 = 0;
    do {
      uVar1 = (rb->high_low_container).typecodes[lVar7];
      if (uVar1 == '\x03') {
        lVar8 = lVar8 + (long)*(rb->high_low_container).containers[lVar7] * 4;
      }
      else if (uVar1 == '\x02') {
        lVar4 = lVar4 + (long)*(rb->high_low_container).containers[lVar7] * 2;
      }
      else {
        lVar6 = lVar6 + 0x2000;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  __dest_00 = buf + lVar6;
  __dest_02 = __dest_00 + lVar8;
  __dest = __dest_02 + lVar4;
  lVar7 = (long)(iVar3 * 2);
  iVar3 = (rb->high_low_container).size;
  if (0 < iVar3) {
    lVar10 = 0;
    __dest_01 = buf;
    do {
      uVar1 = (rb->high_low_container).typecodes[lVar10];
      if (uVar1 == '\x03') {
        piVar2 = (int *)(rb->high_low_container).containers[lVar10];
        memcpy(__dest_00,*(void **)(piVar2 + 2),(long)*piVar2 << 2);
        uVar5 = (ulong)*piVar2;
        __dest_00 = __dest_00 + uVar5 * 4;
      }
      else {
        if (uVar1 == '\x02') {
          piVar2 = (int *)(rb->high_low_container).containers[lVar10];
          memcpy(__dest_02,*(void **)(piVar2 + 2),(long)*piVar2 * 2);
          iVar3 = *piVar2;
          __dest_02 = __dest_02 + (long)iVar3 * 2;
        }
        else {
          bitset = (bitset_container_t *)(rb->high_low_container).containers[lVar10];
          memcpy(__dest_01,bitset->words,0x2000);
          iVar3 = bitset->cardinality;
          if (iVar3 == -1) {
            iVar3 = bitset_container_compute_cardinality(bitset);
          }
          __dest_01 = __dest_01 + 0x2000;
        }
        uVar5 = (ulong)(iVar3 - 1);
      }
      *(short *)(buf + lVar10 * 2 + lVar7 + lVar8 + lVar6 + lVar4) = (short)uVar5;
      lVar10 = lVar10 + 1;
      iVar3 = (rb->high_low_container).size;
    } while (lVar10 < iVar3);
  }
  memcpy(__dest,(rb->high_low_container).keys,(long)iVar3 * 2);
  memcpy(__dest + lVar7 * 2,(rb->high_low_container).typecodes,(long)(rb->high_low_container).size);
  *(uint *)(__dest + lVar7 * 2 + lVar9) = (rb->high_low_container).size << 0xf | 0x35c6;
  return;
}

Assistant:

void roaring_bitmap_frozen_serialize(const roaring_bitmap_t *rb, char *buf) {
    /*
     * Note: we do not require user to supply a specifically aligned buffer.
     * Thus we have to use memcpy() everywhere.
     */

    const roaring_array_t *ra = &rb->high_low_container;

    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_zone_size +=
                    BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                run_zone_size += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                array_zone_size += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }

    uint64_t *bitset_zone = (uint64_t *)arena_alloc(&buf, bitset_zone_size);
    rle16_t *run_zone = (rle16_t *)arena_alloc(&buf, run_zone_size);
    uint16_t *array_zone = (uint16_t *)arena_alloc(&buf, array_zone_size);
    uint16_t *key_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint16_t *count_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint8_t *typecode_zone = (uint8_t *)arena_alloc(&buf, ra->size);
    uint32_t *header_zone = (uint32_t *)arena_alloc(&buf, 4);

    for (int32_t i = 0; i < ra->size; i++) {
        uint16_t count;
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                const bitset_container_t *bc =
                    const_CAST_bitset(ra->containers[i]);
                memcpy(bitset_zone, bc->words,
                       BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t));
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                if (bc->cardinality != BITSET_UNKNOWN_CARDINALITY) {
                    count = (uint16_t)(bc->cardinality - 1);
                } else {
                    count =
                        (uint16_t)(bitset_container_compute_cardinality(bc) -
                                   1);
                }
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                size_t num_bytes = rc->n_runs * sizeof(rle16_t);
                memcpy(run_zone, rc->runs, num_bytes);
                run_zone += rc->n_runs;
                count = (uint16_t)rc->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                size_t num_bytes = ac->cardinality * sizeof(uint16_t);
                memcpy(array_zone, ac->array, num_bytes);
                array_zone += ac->cardinality;
                count = (uint16_t)(ac->cardinality - 1);
                break;
            }
            default:
                roaring_unreachable;
        }
        memcpy(&count_zone[i], &count, 2);
    }
    memcpy(key_zone, ra->keys, ra->size * sizeof(uint16_t));
    memcpy(typecode_zone, ra->typecodes, ra->size * sizeof(uint8_t));
    uint32_t header = ((uint32_t)ra->size << 15) | FROZEN_COOKIE;
    memcpy(header_zone, &header, 4);
}